

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

SymOpnd * __thiscall IR::SymOpnd::CloneUseInternal(SymOpnd *this,Func *func)

{
  StackSym *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  StackSym *sym;
  SymOpnd *pSVar5;
  StackSym *oldSym;
  
  if ((this->super_Opnd).m_kind != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x2ea,"(m_kind == OpndKindSym)","m_kind == OpndKindSym");
    if (!bVar2) goto LAB_006135b1;
    *puVar4 = 0;
  }
  this_00 = (StackSym *)this->m_sym;
  sym = this_00;
  if (((this_00->super_Sym).m_kind == SymKindStack) && ((this_00->field_0x18 & 1) != 0)) {
    sym = StackSym::CloneUse(this_00,func);
    if ((sym->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar2) goto LAB_006135b1;
      *puVar4 = 0;
    }
    if (func->topFunc->m_cloner->clonedInstrGetOrigArgSlotSym != true) goto LAB_0061358f;
    uVar3 = *(uint *)&this_00->field_0x18 & 0x100000;
    if ((uVar3 != 0) && (*(short *)&(this_00->super_Sym).field_0x16 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar2) goto LAB_006135b1;
      *puVar4 = 0;
      uVar3 = *(uint *)&this_00->field_0x18 & 0x100000;
    }
    if (uVar3 != 0) {
      if (sym == this_00) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                           ,0x2f3,"(newSym != oldSym)","newSym != oldSym");
        if (!bVar2) {
LAB_006135b1:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      this->m_sym = &sym->super_Sym;
      sym = this_00;
    }
  }
LAB_0061358f:
  pSVar5 = New(&sym->super_Sym,this->m_offset,(this->super_Opnd).m_type,func);
  return pSVar5;
}

Assistant:

SymOpnd *
SymOpnd::CloneUseInternal(Func *func)
{
    Assert(m_kind == OpndKindSym);
    Sym *sym = this->m_sym;

    if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
    {
        StackSym * oldSym = sym->AsStackSym();
        StackSym * newSym = oldSym->CloneUse(func)->AsStackSym();
        if (func->GetCloner()->clonedInstrGetOrigArgSlotSym && oldSym->IsArgSlotSym())
        {
            Assert(newSym != oldSym);
            this->m_sym = newSym;
            sym = oldSym;
        }
        else
        {
            sym = newSym;
        }
    }

    SymOpnd * newOpnd = SymOpnd::New(sym, m_offset, m_type, func);

    return newOpnd;
}